

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

bool __thiscall QConfFileSettingsPrivate::isWritable(QConfFileSettingsPrivate *this)

{
  bool bVar1;
  QList<QConfFile_*> *in_RDI;
  QConfFile *in_stack_00000020;
  QList<QConfFile_*> *this_00;
  bool local_1;
  
  if ((*(int *)&in_RDI[5].d.d < 2) || (in_RDI[0xb].d.d != (Data *)0x0)) {
    this_00 = in_RDI;
    bVar1 = QList<QConfFile_*>::isEmpty((QList<QConfFile_*> *)0x7afd31);
    if (bVar1) {
      local_1 = false;
    }
    else {
      QList<QConfFile_*>::at(this_00,(qsizetype)in_RDI);
      local_1 = QConfFile::isWritable(in_stack_00000020);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QConfFileSettingsPrivate::isWritable() const
{
#if defined(Q_OS_WASM)
    if (format > QSettings::IniFormat && format != QSettings::WebIndexedDBFormat && !writeFunc)
#else
    if (format > QSettings::IniFormat && !writeFunc)
#endif
        return false;

    if (confFiles.isEmpty())
        return false;

    return confFiles.at(0)->isWritable();
}